

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void __thiscall
FFTAnalyzer::AnalyzeInput
          (FFTAnalyzer *this,float *data,int numchannels,int numsamples,float decaySpeed)

{
  float fVar1;
  float *pfVar2;
  UnityComplexNumber *pUVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  
  CheckInitialized(this);
  uVar10 = this->spectrumSize;
  uVar5 = uVar10 - numsamples;
  pfVar2 = this->ibuffer;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pfVar2[uVar6] = pfVar2[(long)numsamples + uVar6];
  }
  pfVar2 = this->ibuffer;
  uVar6 = 0;
  if (0 < numsamples) {
    uVar6 = (ulong)(uint)numsamples;
  }
  while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
    pfVar2[(int)uVar5] = *data;
    uVar5 = uVar5 + 1;
    data = data + numchannels;
  }
  pUVar3 = this->cspec;
  pfVar2 = this->window;
  pfVar4 = this->ibuffer;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar10) {
    uVar7 = (ulong)uVar10;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pUVar3[uVar6].re = pfVar4[uVar6] * pfVar2[uVar6];
    pUVar3[uVar6].im = 0.0;
  }
  FFTProcess<double>(pUVar3,uVar10,true);
  uVar6 = (long)this->spectrumSize / 2;
  pUVar3 = this->cspec;
  pfVar2 = this->ispec1;
  pfVar4 = this->ispec2;
  uVar8 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    fVar11 = pUVar3[uVar8].re;
    fVar1 = pUVar3[uVar8].im;
    fVar11 = SQRT(fVar11 * fVar11 + fVar1 * fVar1);
    uVar10 = -(uint)(pfVar4[uVar8] < fVar11);
    pfVar2[uVar8] = (float)(~uVar10 & (uint)(pfVar4[uVar8] * decaySpeed) | (uint)fVar11 & uVar10);
  }
  return;
}

Assistant:

void FFTAnalyzer::AnalyzeInput(float* data, int numchannels, int numsamples, float decaySpeed)
{
    CheckInitialized();

    for (int n = 0; n < spectrumSize - numsamples; n++)
        ibuffer[n] = ibuffer[n + numsamples];
    for (int n = 0; n < numsamples; n++)
        ibuffer[n + spectrumSize - numsamples] = data[n * numchannels];
    for (int n = 0; n < spectrumSize; n++)
        cspec[n].Set(ibuffer[n] * window[n], 0.0f);
    Forward(cspec, spectrumSize, true);
    for (int n = 0; n < spectrumSize / 2; n++)
    {
        float a = cspec[n].Magnitude();
        ispec1[n] = (a > ispec2[n]) ? a : ispec2[n] * decaySpeed;
    }
}